

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int inflateInit2_(z_streamp strm,int windowBits,char *version,int stream_size)

{
  internal_state *piVar1;
  inflate_state *state;
  int ret;
  int stream_size_local;
  char *version_local;
  int windowBits_local;
  z_streamp strm_local;
  
  if (((version == (char *)0x0) || (*version != '1')) || (stream_size != 0x70)) {
    strm_local._4_4_ = -6;
  }
  else if (strm == (z_streamp)0x0) {
    strm_local._4_4_ = -2;
  }
  else {
    strm->msg = (char *)0x0;
    if (strm->zalloc == (alloc_func)0x0) {
      strm->zalloc = zcalloc;
      strm->opaque = (voidpf)0x0;
    }
    if (strm->zfree == (free_func)0x0) {
      strm->zfree = zcfree;
    }
    piVar1 = (internal_state *)(*strm->zalloc)(strm->opaque,1,0x1bf8);
    if (piVar1 == (internal_state *)0x0) {
      strm_local._4_4_ = -4;
    }
    else {
      strm->state = piVar1;
      piVar1->strm = strm;
      piVar1->method = '\0';
      *(undefined3 *)&piVar1->field_0x49 = 0;
      piVar1->last_flush = 0;
      piVar1->status = 0x3f34;
      strm_local._4_4_ = inflateReset2(strm,windowBits);
      if (strm_local._4_4_ != 0) {
        (*strm->zfree)(strm->opaque,piVar1);
        strm->state = (internal_state *)0x0;
      }
    }
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateInit2_(z_streamp strm, int windowBits,
                          const char *version, int stream_size) {
    int ret;
    struct inflate_state FAR *state;

    if (version == Z_NULL || version[0] != ZLIB_VERSION[0] ||
        stream_size != (int)(sizeof(z_stream)))
        return Z_VERSION_ERROR;
    if (strm == Z_NULL) return Z_STREAM_ERROR;
    strm->msg = Z_NULL;                 /* in case we return an error */
    if (strm->zalloc == (alloc_func)0) {
#ifdef Z_SOLO
        return Z_STREAM_ERROR;
#else
        strm->zalloc = zcalloc;
        strm->opaque = (voidpf)0;
#endif
    }
    if (strm->zfree == (free_func)0)
#ifdef Z_SOLO
        return Z_STREAM_ERROR;
#else
        strm->zfree = zcfree;
#endif
    state = (struct inflate_state FAR *)
            ZALLOC(strm, 1, sizeof(struct inflate_state));
    if (state == Z_NULL) return Z_MEM_ERROR;
    Tracev((stderr, "inflate: allocated\n"));
    strm->state = (struct internal_state FAR *)state;
    state->strm = strm;
    state->window = Z_NULL;
    state->mode = HEAD;     /* to pass state test in inflateReset2() */
    ret = inflateReset2(strm, windowBits);
    if (ret != Z_OK) {
        ZFREE(strm, state);
        strm->state = Z_NULL;
    }
    return ret;
}